

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall glslang::HlslGrammar::acceptJumpStatement(HlslGrammar *this,TIntermNode **statement)

{
  bool bVar1;
  bool bVar2;
  EHlslTokenClass EVar3;
  TIntermTyped *in_RAX;
  TIntermBranch *pTVar4;
  char *pcVar5;
  TOperator branchOp;
  TIntermediate *this_00;
  HlslParseContext *pHVar6;
  _func_int **pp_Var7;
  uint uVar8;
  TIntermTyped *node;
  TIntermTyped *local_28;
  
  local_28 = in_RAX;
  EVar3 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  uVar8 = EVar3 - EHTokBreak;
  if (5 < uVar8) {
    return false;
  }
  if ((0x33U >> (uVar8 & 0x1f) & 1) == 0) {
    return false;
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  switch(uVar8) {
  case 0:
    pTVar4 = TIntermediate::addBranch
                       (this->intermediate,EOpBreak,&(this->super_HlslTokenStream).token.loc);
    *statement = &pTVar4->super_TIntermNode;
    pHVar6 = this->parseContext;
    if (((pHVar6->super_TParseContextBase).loopNestingLevel == 0) &&
       ((pHVar6->super_TParseContextBase).switchSequenceStack.
        super_list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
        .
        super__List_base<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
        ._M_impl._M_node._M_size == 0)) {
      pp_Var7 = (pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar5 = "loop or switch";
      goto LAB_0042e765;
    }
    goto LAB_0042e787;
  case 1:
    pTVar4 = TIntermediate::addBranch
                       (this->intermediate,EOpContinue,&(this->super_HlslTokenStream).token.loc);
    *statement = &pTVar4->super_TIntermNode;
    pHVar6 = this->parseContext;
    if ((pHVar6->super_TParseContextBase).loopNestingLevel != 0) goto LAB_0042e787;
    pp_Var7 = (pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar5 = "loop";
LAB_0042e765:
    bVar1 = false;
    goto LAB_0042e7c1;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslGrammar.cpp"
                  ,0x106c,"bool glslang::HlslGrammar::acceptJumpStatement(TIntermNode *&)");
  case 4:
    this_00 = this->intermediate;
    branchOp = EOpKill;
LAB_0042e77f:
    pTVar4 = TIntermediate::addBranch(this_00,branchOp,&(this->super_HlslTokenStream).token.loc);
    break;
  case 5:
    bVar1 = acceptExpression(this,&local_28);
    if (!bVar1) {
      this_00 = this->intermediate;
      branchOp = EOpReturn;
      goto LAB_0042e77f;
    }
    pTVar4 = (TIntermBranch *)
             HlslParseContext::handleReturnValue
                       (this->parseContext,&(this->super_HlslTokenStream).token.loc,local_28);
  }
  *statement = &pTVar4->super_TIntermNode;
LAB_0042e787:
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
  bVar1 = true;
  if (!bVar2) {
    pHVar6 = this->parseContext;
    pp_Var7 = (pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar5 = ";";
    bVar1 = true;
LAB_0042e7c1:
    (*pp_Var7[0x2d])(pHVar6,&(this->super_HlslTokenStream).token,"Expected",pcVar5,"");
  }
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptJumpStatement(TIntermNode*& statement)
{
    EHlslTokenClass jump = peek();
    switch (jump) {
    case EHTokContinue:
    case EHTokBreak:
    case EHTokDiscard:
    case EHTokReturn:
        advanceToken();
        break;
    default:
        // not something we handle in this function
        return false;
    }

    switch (jump) {
    case EHTokContinue:
        statement = intermediate.addBranch(EOpContinue, token.loc);
        if (parseContext.loopNestingLevel == 0) {
            expected("loop");
            return false;
        }
        break;
    case EHTokBreak:
        statement = intermediate.addBranch(EOpBreak, token.loc);
        if (parseContext.loopNestingLevel == 0 && parseContext.switchSequenceStack.size() == 0) {
            expected("loop or switch");
            return false;
        }
        break;
    case EHTokDiscard:
        statement = intermediate.addBranch(EOpKill, token.loc);
        break;

    case EHTokReturn:
    {
        // expression
        TIntermTyped* node;
        if (acceptExpression(node)) {
            // hook it up
            statement = parseContext.handleReturnValue(token.loc, node);
        } else
            statement = intermediate.addBranch(EOpReturn, token.loc);
        break;
    }

    default:
        assert(0);
        return false;
    }

    // SEMICOLON
    if (! acceptTokenClass(EHTokSemicolon))
        expected(";");

    return true;
}